

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::i2p_connection::
set_local_endpoint<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_connection *this,error_code *ec,char *dest,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  char *pcVar1;
  code *UNRECOVERED_JUMPTABLE;
  long *plVar2;
  
  if ((dest == (char *)0x0) || (ec->failed_ != false)) {
    (this->m_i2p_local_endpoint)._M_string_length = 0;
    *(this->m_i2p_local_endpoint)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar1 = (char *)(this->m_i2p_local_endpoint)._M_string_length;
    strlen(dest);
    ::std::__cxx11::string::_M_replace((ulong)&this->m_i2p_local_endpoint,0,pcVar1,(ulong)dest);
  }
  UNRECOVERED_JUMPTABLE = (code *)h->_M_f;
  plVar2 = (long *)((long)&(((h->_M_bound_args).
                             super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                             .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>.
                            _M_head_impl)->super_session_interface).super_session_logger.
                           _vptr_session_logger + *(long *)&h->field_0x8);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar2,ec);
  return;
}

Assistant:

void set_local_endpoint(error_code const& ec, char const* dest, Handler h)
	{
		if (!ec && dest != nullptr)
			m_i2p_local_endpoint = dest;
		else
			m_i2p_local_endpoint.clear();

		h(ec);
	}